

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address(Address *this,NetType_conflict type,Script *script,uint8_t prefix)

{
  NetType_conflict NVar1;
  undefined7 in_register_00000009;
  uint8_t prefix_local;
  Pubkey *local_68;
  ByteData *local_60;
  string *local_58;
  AddressType local_4c;
  CfdSourceLocation local_48;
  
  NVar1 = kCfdConnectionError;
  if ((int)CONCAT71(in_register_00000009,prefix) == 0) {
    NVar1 = type;
  }
  this->type_ = NVar1;
  this->addr_type_ = kP2shAddress;
  this->witness_ver_ = kVersionNone;
  prefix_local = prefix;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_48);
  local_58 = &this->address_;
  ByteData::ByteData(&this->hash_);
  local_60 = &this->hash_;
  Pubkey::Pubkey(&this->pubkey_);
  local_68 = &this->pubkey_;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_,script);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  CalculateP2SH(this,prefix);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x16b;
  local_48.funcname = "Address";
  local_4c = kP2shAddress;
  logger::info<cfd::core::NetType&,cfd::core::AddressType,unsigned_char&>
            (&local_48,"call Address({},{},{})",&this->type_,&local_4c,&prefix_local);
  return;
}

Assistant:

Address::Address(NetType type, const Script& script, uint8_t prefix)
    : type_((prefix != 0) ? kCustomChain : type),
      addr_type_(AddressType::kP2shAddress),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_(script) {
  memset(checksum_, 0, sizeof(checksum_));
  CalculateP2SH(prefix);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2shAddress, prefix);
}